

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

void __thiscall
google::protobuf::ServiceDescriptor::DebugString(ServiceDescriptor *this,string *contents)

{
  int iVar1;
  string *value;
  ServiceOptions *options;
  MethodDescriptor *this_00;
  int local_214;
  undefined1 local_210 [4];
  int i;
  SubstituteArg local_1e0;
  SubstituteArg local_1b0;
  SubstituteArg local_180;
  SubstituteArg local_150;
  SubstituteArg local_120;
  SubstituteArg local_f0;
  SubstituteArg local_c0;
  SubstituteArg local_90;
  SubstituteArg local_60;
  string *local_30;
  string *contents_local;
  ServiceDescriptor *this_local;
  
  local_30 = contents;
  contents_local = (string *)this;
  value = name_abi_cxx11_(this);
  strings::internal::SubstituteArg::SubstituteArg(&local_60,value);
  strings::internal::SubstituteArg::SubstituteArg(&local_90);
  strings::internal::SubstituteArg::SubstituteArg(&local_c0);
  strings::internal::SubstituteArg::SubstituteArg(&local_f0);
  strings::internal::SubstituteArg::SubstituteArg(&local_120);
  strings::internal::SubstituteArg::SubstituteArg(&local_150);
  strings::internal::SubstituteArg::SubstituteArg(&local_180);
  strings::internal::SubstituteArg::SubstituteArg(&local_1b0);
  strings::internal::SubstituteArg::SubstituteArg(&local_1e0);
  strings::internal::SubstituteArg::SubstituteArg((SubstituteArg *)local_210);
  strings::SubstituteAndAppend
            (contents,"service $0 {\n",&local_60,&local_90,&local_c0,&local_f0,&local_120,&local_150
             ,&local_180,&local_1b0,&local_1e0,(SubstituteArg *)local_210);
  options = ServiceDescriptor::options(this);
  anon_unknown_1::FormatLineOptions(1,&options->super_Message,local_30);
  local_214 = 0;
  while( true ) {
    iVar1 = method_count(this);
    if (iVar1 <= local_214) break;
    this_00 = method(this,local_214);
    MethodDescriptor::DebugString(this_00,1,local_30);
    local_214 = local_214 + 1;
  }
  std::__cxx11::string::append((char *)local_30);
  return;
}

Assistant:

void ServiceDescriptor::DebugString(string *contents) const {
  strings::SubstituteAndAppend(contents, "service $0 {\n", name());

  FormatLineOptions(1, options(), contents);

  for (int i = 0; i < method_count(); i++) {
    method(i)->DebugString(1, contents);
  }

  contents->append("}\n");
}